

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void talismanic_reward(CHAR_DATA *ch)

{
  PC_DATA *pPVar1;
  int iVar2;
  CHAR_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  int in_stack_0000121c;
  CHAR_DATA *in_stack_00001220;
  
  if (in_RDI->in_room->vnum == 0x23bc) {
    in_RDI->pcdata->quests[2] = 6;
    pPVar1 = in_RDI->pcdata;
    iVar2 = skill_lookup((char *)in_RDI);
    pPVar1->learned[iVar2] = 0x46;
  }
  else {
    send_to_char((char *)unaff_retaddr,in_RDI);
    WAIT_STATE(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    send_to_char((char *)unaff_retaddr,in_RDI);
    gain_exp(in_stack_00001220,in_stack_0000121c);
  }
  return;
}

Assistant:

void talismanic_reward(CHAR_DATA *ch)
{
	if (ch->in_room->vnum == 9148)
	{
		ch->pcdata->quests[TALISMANIC_QUEST] = 6;
		ch->pcdata->learned[skill_lookup("talismanic aura")] = 70;
	}
	else
	{
		send_to_char("You pause briefly to reflect on all you have seen and learned in your dealings with the hermit.\n\r", ch);

		WAIT_STATE(ch, PULSE_VIOLENCE * 3);

		send_to_char("You feel more experienced!\n\r", ch);
		gain_exp(ch, 4500);
	}
}